

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_udata.c
# Opt level: O1

void * lj_lightud_intern(lua_State *L,void *p)

{
  byte bVar1;
  uint *p_00;
  GCSize nsz;
  void *pvVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  void *pvVar9;
  uint uVar10;
  bool bVar11;
  
  uVar7 = (ulong)(L->glref).ptr32;
  uVar10 = (uint)((ulong)p >> 0x20) & 0xffffff80;
  p_00 = (uint *)(ulong)*(uint *)(uVar7 + 0x88);
  bVar1 = *(byte *)(uVar7 + 0x5b);
  pvVar2 = (void *)(ulong)bVar1;
  pvVar9 = pvVar2;
  if (p_00 != (uint *)0x0) {
    if (*p_00 == uVar10) {
      uVar6 = 0;
      bVar11 = false;
    }
    else {
      pvVar5 = (void *)0x0;
      do {
        pvVar4 = pvVar5;
        pvVar5 = (void *)((long)pvVar4 + 1);
        if (pvVar5 == (void *)((long)pvVar2 + 1)) {
          bVar11 = pvVar2 <= pvVar4;
          if (0xfd < bVar1) {
            lj_err_msg(L,LJ_ERR_BADLU);
          }
          pvVar9 = (void *)(ulong)(bVar1 + 1);
          goto LAB_001178d0;
        }
      } while (p_00[(long)pvVar5] != uVar10);
      bVar11 = pvVar2 <= pvVar4;
      uVar6 = (long)pvVar5 << 0x27;
    }
    pvVar2 = (void *)((ulong)p & 0x7fffffffff | uVar6);
LAB_001178d0:
    if (!bVar11) {
      return pvVar2;
    }
  }
  iVar8 = (int)pvVar9;
  if ((iVar8 != 1) &&
     (uVar3 = iVar8 - ((uint)((ulong)pvVar9 >> 1) & 0x55),
     uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
     ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
    nsz = 8;
    if (iVar8 != 0) {
      nsz = iVar8 * 8;
    }
    p_00 = (uint *)lj_mem_realloc(L,p_00,iVar8 * 4,nsz);
    *(int *)(uVar7 + 0x88) = (int)p_00;
  }
  *(char *)(uVar7 + 0x5b) = (char)pvVar9;
  p_00[(long)pvVar9] = uVar10;
  return (void *)((ulong)p & 0x7fffffffff | (long)pvVar9 << 0x27);
}

Assistant:

void *lj_lightud_intern(lua_State *L, void *p)
{
  global_State *g = G(L);
  uint64_t u = (uint64_t)p;
  uint32_t up = lightudup(u);
  uint32_t *segmap = mref(g->gc.lightudseg, uint32_t);
  MSize segnum = g->gc.lightudnum;
  if (segmap) {
    MSize seg;
    for (seg = 0; seg <= segnum; seg++)
      if (segmap[seg] == up)  /* Fast path. */
	return (void *)(((uint64_t)seg << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
    segnum++;
    /* Leave last segment unused to avoid clash with ITERN key. */
    if (segnum >= (1 << LJ_LIGHTUD_BITS_SEG)-1) lj_err_msg(L, LJ_ERR_BADLU);
  }
  if (!((segnum-1) & segnum) && segnum != 1) {
    lj_mem_reallocvec(L, segmap, segnum, segnum ? 2*segnum : 2u, uint32_t);
    setmref(g->gc.lightudseg, segmap);
  }
  g->gc.lightudnum = segnum;
  segmap[segnum] = up;
  return (void *)(((uint64_t)segnum << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
}